

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
wabt::MakeUnique<wabt::ReturnCallIndirectExpr>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
  in_RDI;
  Location local_38;
  
  puVar1 = (undefined8 *)operator_new(0xc0);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0x21;
  *puVar1 = &PTR__ReturnCallIndirectExpr_015453e8;
  *(undefined1 *)(puVar1 + 8) = 0;
  local_38.field_1.field_0.line = 0;
  local_38.field_1._4_8_ = 0;
  local_38.filename.data_ = (char *)0x0;
  local_38.filename.size_._0_4_ = 0;
  local_38.filename.size_._4_4_ = 0;
  Var::Var((Var *)(puVar1 + 9),0xffffffff,&local_38);
  puVar1[0x16] = 0;
  puVar1[0x17] = 0;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
   .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
          )(tuple<wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
             .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}